

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header7.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Header7::Decode(Header7 *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  undefined7 in_register_00000011;
  KString local_40;
  
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) != 0) {
    return;
  }
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0xb < KVar1) {
    KDataStream::Read(stream,&(this->super_Header6).m_ui8ProtocolVersion);
    KDataStream::Read(stream,&(this->super_Header6).m_ui8ExerciseID);
    KDataStream::Read(stream,&(this->super_Header6).m_ui8PDUType);
    KDataStream::Read(stream,&(this->super_Header6).m_ui8ProtocolFamily);
    (*(this->super_Header6).m_TimeStamp.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_Header6).m_TimeStamp,stream);
    KDataStream::Read<unsigned_short>(stream,&(this->super_Header6).m_ui16PDULength);
    KDataStream::Read(stream,&(this->super_Header6).m_ui8Padding1 +
                             (ulong)((this->super_Header6).m_ui8ProtocolFamily != '\v') * 2);
    KDataStream::Read(stream,&(this->super_Header6).m_ui8Padding2);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Header7::Decode(KDataStream &stream, bool ignoreHeader /*= false*/ ) noexcept(false)
{
    if( !ignoreHeader )
    {
        if( stream.GetBufferSize() < HEADER6_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

        stream >> m_ui8ProtocolVersion
               >> m_ui8ExerciseID
               >> m_ui8PDUType
               >> m_ui8ProtocolFamily
               >> KDIS_STREAM m_TimeStamp
               >> m_ui16PDULength
               >> ( ( m_ui8ProtocolFamily == LiveEntity ) ? m_ui8Padding1 : m_PDUStatusUnion.m_ui8PDUStatus ) // LE family use the padding for the sub protocol field.
               >> m_ui8Padding2;
    }
}